

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O0

void __thiscall FastLinearExpert::modelDisplay(FastLinearExpert *this,ostream *out)

{
  ostream *poVar1;
  void *pvVar2;
  ostream *in_RSI;
  long in_RDI;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_00000238;
  ostream *in_stack_00000240;
  
  std::operator<<(in_RSI,"Nu=\n");
  poVar1 = Eigen::operator<<(in_stack_00000240,in_stack_00000238);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"invSigma=\n");
  poVar1 = Eigen::operator<<(in_stack_00000240,
                             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                             in_stack_00000238);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"Mu=\n");
  poVar1 = Eigen::operator<<(in_stack_00000240,in_stack_00000238);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"Lambda=\n");
  poVar1 = Eigen::operator<<(in_stack_00000240,
                             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                             in_stack_00000238);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"Psi=\n");
  poVar1 = Eigen::operator<<(in_stack_00000240,in_stack_00000238);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"H=\n");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0x80));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"Sh=\n");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0x88));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"Sz=\n");
  poVar1 = Eigen::operator<<(in_stack_00000240,in_stack_00000238);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"Sx=\n");
  poVar1 = Eigen::operator<<(in_stack_00000240,in_stack_00000238);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"Sxz=\n");
  poVar1 = Eigen::operator<<(in_stack_00000240,
                             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                             in_stack_00000238);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"invSzz=\n");
  poVar1 = Eigen::operator<<(in_stack_00000240,
                             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                             in_stack_00000238);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"invSzz0=\n");
  poVar1 = Eigen::operator<<(in_stack_00000240,
                             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                             in_stack_00000238);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"detInvSzz0=\n");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0x300));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"Sxx=\n");
  poVar1 = Eigen::operator<<(in_stack_00000240,in_stack_00000238);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"Nu0=\n");
  poVar1 = Eigen::operator<<(in_stack_00000240,in_stack_00000238);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

EXPERT_CLASS_TEMPLATE
void FAST_LINEAR_EXPERT_base::modelDisplay(std::ostream &out) const
{
    out << EXPAND_N(Nu) << std::endl;
    out << EXPAND_N(invSigma) << std::endl;
    out << EXPAND_N(Mu) << std::endl;
    out << EXPAND_N(Lambda) << std::endl;
    out << EXPAND_N(Psi) << std::endl;

    out << EXPAND_N(H) << std::endl;
    out << EXPAND_N(Sh) << std::endl;
    out << EXPAND_N(Sz) << std::endl;
    out << EXPAND_N(Sx) << std::endl;
    out << EXPAND_N(Sxz) << std::endl;
    out << EXPAND_N(invSzz) << std::endl;
    out << EXPAND_N(invSzz0) << std::endl;
    out << EXPAND_N(detInvSzz0) << std::endl;
    out << EXPAND_N(Sxx) << std::endl;
    out << EXPAND_N(Nu0) << std::endl;
//
//    out << EXPAND(wPsi) << std::endl;
//    out << EXPAND(wNu) << std::endl;
//    out << EXPAND(wSigma) << std::endl;
//    out << EXPAND(wLambda) << std::endl;
//    out << EXPAND(alpha) << std::endl;
//    out << EXPAND(mixture->getPsi()) << std::endl;
//    out << EXPAND(mixture->getSigma()) << std::endl;
}